

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<signed_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  Value VVar3;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  auVar1 = packsswb((undefined1  [16])VVar3.field_0,(undefined1  [16])VVar3.field_0);
  VVar3.field_0._0_8_ = auVar1._0_8_;
  auVar1 = packsswb((undefined1  [16])VVar2.field_0,(undefined1  [16])VVar2.field_0);
  VVar3.field_0._8_8_ = auVar1._0_8_;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}